

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O0

void work_gga_exc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  double s_ave;
  double my_sigma [3];
  double my_rho [2];
  double dens;
  size_t ip;
  xc_gga_out_params *in_stack_000003e0;
  double *in_stack_000003e8;
  double *in_stack_000003f0;
  size_t in_stack_000003f8;
  xc_func_type *in_stack_00000400;
  double local_a8;
  double local_a0;
  double local_98;
  undefined8 local_90;
  double local_88;
  undefined8 local_80;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  undefined8 local_48;
  undefined8 local_40;
  double local_38;
  ulong local_30;
  long local_20;
  long local_18;
  ulong local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_48,0,0x10);
  memset(&local_68,0,0x18);
  for (local_30 = 0; local_30 < local_10; local_30 = local_30 + 1) {
    if (*(int *)(local_8 + 8) == 2) {
      local_78 = *(double *)(local_18 + local_30 * (long)*(int *)(local_8 + 0x48) * 8) +
                 *(double *)(local_18 + 8 + local_30 * (long)*(int *)(local_8 + 0x48) * 8);
    }
    else {
      local_78 = *(double *)(local_18 + local_30 * (long)*(int *)(local_8 + 0x48) * 8);
    }
    local_38 = local_78;
    if (*(double *)(local_8 + 0x180) <= local_78) {
      if (*(double *)(local_18 + local_30 * (long)*(int *)(local_8 + 0x48) * 8) <=
          *(double *)(local_8 + 0x180)) {
        local_80 = *(undefined8 *)(local_8 + 0x180);
      }
      else {
        local_80 = *(undefined8 *)(local_18 + local_30 * (long)*(int *)(local_8 + 0x48) * 8);
      }
      local_48 = local_80;
      if (*(double *)(local_20 + local_30 * (long)*(int *)(local_8 + 0x4c) * 8) <=
          *(double *)(local_8 + 400) * *(double *)(local_8 + 400)) {
        local_88 = *(double *)(local_8 + 400) * *(double *)(local_8 + 400);
      }
      else {
        local_88 = *(double *)(local_20 + local_30 * (long)*(int *)(local_8 + 0x4c) * 8);
      }
      local_68 = local_88;
      if (*(int *)(local_8 + 8) == 2) {
        if (*(double *)(local_18 + 8 + local_30 * (long)*(int *)(local_8 + 0x48) * 8) <=
            *(double *)(local_8 + 0x180)) {
          local_90 = *(undefined8 *)(local_8 + 0x180);
        }
        else {
          local_90 = *(undefined8 *)(local_18 + 8 + local_30 * (long)*(int *)(local_8 + 0x48) * 8);
        }
        local_40 = local_90;
        if (*(double *)(local_20 + 0x10 + local_30 * (long)*(int *)(local_8 + 0x4c) * 8) <=
            *(double *)(local_8 + 400) * *(double *)(local_8 + 400)) {
          local_98 = *(double *)(local_8 + 400) * *(double *)(local_8 + 400);
        }
        else {
          local_98 = *(double *)(local_20 + 0x10 + local_30 * (long)*(int *)(local_8 + 0x4c) * 8);
        }
        local_58 = local_98;
        local_a0 = *(double *)(local_20 + 8 + local_30 * (long)*(int *)(local_8 + 0x4c) * 8);
        local_a8 = (local_88 + local_98) * 0.5;
        if (local_a0 < -local_a8) {
          local_a0 = -local_a8;
        }
        if (local_a0 <= local_a8) {
          local_a8 = local_a0;
        }
        local_60 = local_a8;
      }
      func_exc_pol(in_stack_00000400,in_stack_000003f8,in_stack_000003f0,in_stack_000003e8,
                   in_stack_000003e0);
    }
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}